

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall QMenuPrivate::hideUpToMenuBar(QMenuPrivate *this)

{
  QWidget *this_00;
  Data *pDVar1;
  long lVar2;
  int iVar3;
  QStyle *pQVar4;
  QMenuBar *pQVar5;
  QMenu *menu;
  QObject *object;
  
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pQVar4 = QWidget::style(this_00);
  iVar3 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x52,0);
  if ((this->field_0x421 & 4) == 0) {
    pDVar1 = (this->causedPopup).widget.wp.d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      object = (QObject *)0x0;
    }
    else {
      object = (this->causedPopup).widget.wp.value;
    }
    hideMenu(this,(QMenu *)this_00);
    while (object != (QObject *)0x0) {
      pQVar5 = QtPrivate::qobject_cast_helper<QMenuBar*,QObject>(object);
      if (pQVar5 == (QMenuBar *)0x0) {
        menu = QtPrivate::qobject_cast_helper<QMenu*,QObject>(object);
        object = (QObject *)0x0;
        if (menu != (QMenu *)0x0) {
          lVar2 = *(long *)&(menu->super_QWidget).field_0x8;
          if ((*(long *)(lVar2 + 0x2f8) == 0) || (*(int *)(*(long *)(lVar2 + 0x2f8) + 4) == 0)) {
            object = (QObject *)0x0;
          }
          else {
            object = *(QObject **)(lVar2 + 0x300);
          }
          if ((*(byte *)(lVar2 + 0x421) & 4) == 0) {
            hideMenu(this,menu);
          }
          if (iVar3 == 0) {
            setCurrentAction(*(QMenuPrivate **)&(menu->super_QWidget).field_0x8,(QAction *)0x0,-1,
                             SelectedFromElsewhere,false);
          }
        }
      }
      else {
        QMenuBarPrivate::setCurrentAction
                  (*(QMenuBarPrivate **)&(pQVar5->super_QWidget).field_0x8,(QAction *)0x0,false,
                   false);
        QMenuBarPrivate::setKeyboardMode
                  (*(QMenuBarPrivate **)&(pQVar5->super_QWidget).field_0x8,false);
        object = (QObject *)0x0;
      }
    }
  }
  setCurrentAction(this,(QAction *)0x0,-1,SelectedFromElsewhere,false);
  return;
}

Assistant:

void QMenuPrivate::hideUpToMenuBar()
{
    Q_Q(QMenu);
    bool fadeMenus = q->style()->styleHint(QStyle::SH_Menu_FadeOutOnHide, nullptr, q);
    if (!tornoff) {
        QWidget *caused = causedPopup.widget;
        hideMenu(q); //hide after getting causedPopup
        while(caused) {
#if QT_CONFIG(menubar)
            if (QMenuBar *mb = qobject_cast<QMenuBar*>(caused)) {
                mb->d_func()->setCurrentAction(nullptr);
                mb->d_func()->setKeyboardMode(false);
                caused = nullptr;
            } else
#endif
            if (QMenu *m = qobject_cast<QMenu*>(caused)) {
                caused = m->d_func()->causedPopup.widget;
                if (!m->d_func()->tornoff)
                    hideMenu(m);
                if (!fadeMenus) // Mac doesn't clear the action until after hidden.
                    m->d_func()->setCurrentAction(nullptr);
            } else {                caused = nullptr;
            }
        }
    }
    setCurrentAction(nullptr);
}